

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_texture_op(CompilerGLSL *this,Instruction *i,bool sparse)

{
  uint32_t *puVar1;
  uint *puVar2;
  char (*in_stack_fffffffffffffe70) [2];
  uint *inherit;
  uint *__end1;
  uint *__begin1;
  SmallVector<unsigned_int,_8UL> *__range1;
  string local_130;
  spirv_cross local_110 [32];
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  string expr;
  uint32_t uStack_88;
  bool forward;
  uint32_t sparse_texel_id;
  uint32_t sparse_code_id;
  SPIRType *local_78;
  SPIRType *return_type;
  uint32_t id;
  uint32_t result_type_id;
  SmallVector<unsigned_int,_8UL> inherited_expressions;
  Op op;
  uint32_t *ops;
  bool sparse_local;
  Instruction *i_local;
  CompilerGLSL *this_local;
  
  puVar1 = Compiler::stream(&this->super_Compiler,i);
  inherited_expressions.stack_storage.aligned_char._28_4_ = ZEXT24(i->op);
  SmallVector<unsigned_int,_8UL>::SmallVector((SmallVector<unsigned_int,_8UL> *)&id);
  return_type._4_4_ = *puVar1;
  return_type._0_4_ = puVar1[1];
  local_78 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,return_type._4_4_);
  uStack_88 = 0;
  expr.field_2._12_4_ = 0;
  if (sparse) {
    emit_sparse_feedback_temporaries
              (this,return_type._4_4_,(uint32_t)return_type,&stack0xffffffffffffff78,
               (uint32_t *)(expr.field_2._M_local_buf + 0xc));
  }
  expr.field_2._M_local_buf[0xb] = '\0';
  (*(this->super_Compiler)._vptr_Compiler[0x11])
            (local_b0,this,i,(ulong)(sparse & 1),(undefined1 *)((long)&expr.field_2 + 0xb));
  if (sparse) {
    to_expression_abi_cxx11_(&local_d0,this,uStack_88,true);
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (this,&local_d0,(char (*) [4])0x4a41f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
               (char (*) [2])0x4af37c);
    ::std::__cxx11::string::~string((string *)&local_d0);
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_110,this,local_78,0);
    to_expression_abi_cxx11_(&local_130,this,uStack_88,true);
    to_expression_abi_cxx11_((string *)&__range1,this,expr.field_2._12_4_,true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              (&local_f0,local_110,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a488c,
               (char (*) [2])&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
               (char (*) [3])&__range1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
               in_stack_fffffffffffffe70);
    ::std::__cxx11::string::operator=((string *)local_b0,(string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&__range1);
    ::std::__cxx11::string::~string((string *)&local_130);
    ::std::__cxx11::string::~string((string *)local_110);
    expr.field_2._M_local_buf[0xb] = '\x01';
    SmallVector<unsigned_int,_8UL>::clear((SmallVector<unsigned_int,_8UL> *)&id);
  }
  emit_op(this,return_type._4_4_,(uint32_t)return_type,(string *)local_b0,
          (bool)(expr.field_2._M_local_buf[0xb] & 1),false);
  __end1 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)&id);
  puVar2 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)&id);
  for (; __end1 != puVar2; __end1 = __end1 + 1) {
    Compiler::inherit_expression_dependencies(&this->super_Compiler,(uint32_t)return_type,*__end1);
  }
  if ((((inherited_expressions.stack_storage.aligned_char._28_4_ == 0x57) ||
       (inherited_expressions.stack_storage.aligned_char._28_4_ == 0x59)) ||
      (inherited_expressions.stack_storage.aligned_char._28_4_ == 0x5b)) ||
     (inherited_expressions.stack_storage.aligned_char._28_4_ == 0x5d)) {
    register_control_dependent_expression(this,(uint32_t)return_type);
  }
  ::std::__cxx11::string::~string((string *)local_b0);
  SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)&id);
  return;
}

Assistant:

void CompilerGLSL::emit_texture_op(const Instruction &i, bool sparse)
{
	auto *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	SmallVector<uint32_t> inherited_expressions;

	uint32_t result_type_id = ops[0];
	uint32_t id = ops[1];
	auto &return_type = get<SPIRType>(result_type_id);

	uint32_t sparse_code_id = 0;
	uint32_t sparse_texel_id = 0;
	if (sparse)
		emit_sparse_feedback_temporaries(result_type_id, id, sparse_code_id, sparse_texel_id);

	bool forward = false;
	string expr = to_texture_op(i, sparse, &forward, inherited_expressions);

	if (sparse)
	{
		statement(to_expression(sparse_code_id), " = ", expr, ";");
		expr = join(type_to_glsl(return_type), "(", to_expression(sparse_code_id), ", ", to_expression(sparse_texel_id),
		            ")");
		forward = true;
		inherited_expressions.clear();
	}

	emit_op(result_type_id, id, expr, forward);
	for (auto &inherit : inherited_expressions)
		inherit_expression_dependencies(id, inherit);

	// Do not register sparse ops as control dependent as they are always lowered to a temporary.
	switch (op)
	{
	case OpImageSampleDrefImplicitLod:
	case OpImageSampleImplicitLod:
	case OpImageSampleProjImplicitLod:
	case OpImageSampleProjDrefImplicitLod:
		register_control_dependent_expression(id);
		break;

	default:
		break;
	}
}